

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CConstExpression *expression)

{
  uint __val;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  PrintVisitor *this_00;
  uint __len;
  string __str;
  string local_90;
  string local_70;
  string local_50;
  
  this->lastVisited = this->lastVisited + 1;
  uVar2 = CConstExpression::getValue(expression);
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_001301a6;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_001301a6;
      }
      if (uVar3 < 10000) goto LAB_001301a6;
      uVar4 = uVar4 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_001301a6:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar2 >> 0x1f));
  this_00 = (PrintVisitor *)(ulong)__len;
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uVar2 >> 0x1f),__len,__val);
  ConstructLabel(&local_50,this_00,&local_70,this->lastVisited);
  std::__cxx11::string::operator=((string *)&this->description,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  AddArrow(this,this->lastVisited);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Const","");
  AddLabel(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CConstExpression &expression ) {
    ++lastVisited;
    description = ConstructLabel( std::to_string( expression.getValue( )), lastVisited );
    AddArrow( lastVisited );
    AddLabel( "Const" );
    ++lastVisited;
}